

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

void __thiscall
deci::ast_for_t::ast_for_t
          (ast_for_t *this,string *identifier,ast_item_t *start,ast_item_t *finish,ast_t *loop,
          ast_item_t *step)

{
  (this->super_ast_loop_t).super_ast_item_t.parent = (ast_item_t *)0x0;
  (this->super_ast_loop_t).end_loc_pos = -1;
  (this->super_ast_loop_t).super_ast_item_t._vptr_ast_item_t =
       (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011d640;
  std::__cxx11::string::string((string *)&this->identifier,(string *)identifier);
  this->start = start;
  this->finish = finish;
  this->loop = loop;
  this->step = step;
  return;
}

Assistant:

ast_for_t::ast_for_t(const std::string& identifier, ast_item_t* start, ast_item_t* finish, ast_t* loop, ast_item_t* step)
    :identifier(identifier), start(start), finish(finish), loop(loop), step(step) {
    ;
  }